

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O3

int __thiscall bdQuery::trimProxies(bdQuery *this)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  
  uVar1 = (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
          _M_size;
  while (10 < uVar1) {
    p_Var2 = (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
    (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
    _M_size = uVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x58);
    uVar1 = (this->mProxiesUnknown).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
            _M_node._M_size;
  }
  uVar1 = (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
          _M_size;
  while (10 < uVar1) {
    p_Var2 = (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
    (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
    _M_size = uVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x58);
    uVar1 = (this->mProxiesFlagged).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl.
            _M_node._M_size;
  }
  return 1;
}

Assistant:

int bdQuery::trimProxies() {

	/* drop excess Potential Proxies */
	while(mProxiesUnknown.size() > MAX_POTENTIAL_PROXIES)
		mProxiesUnknown.pop_back();

	while(mProxiesFlagged.size() > MAX_POTENTIAL_PROXIES)
		mProxiesFlagged.pop_back();
	return 1;
}